

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Updater.cpp
# Opt level: O3

void __thiscall Updater::setUpdateAvailable(Updater *this,bool available)

{
  QArrayData *pQVar1;
  long lVar2;
  Downloader *pDVar3;
  Data *pDVar4;
  qsizetype qVar5;
  QString *pQVar6;
  byte bVar7;
  int iVar8;
  iterator iVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QString t;
  QString title;
  QMessageBox box;
  QString local_118;
  QArrayDataPointer<QString> local_f8;
  QArrayData *local_e0;
  QString *local_d8;
  qsizetype qStack_d0;
  QArrayData *local_c8;
  QString *pQStack_c0;
  qsizetype qStack_b8;
  QArrayData *local_b0;
  char16_t *local_a8;
  qsizetype local_a0;
  QArrayData *local_98;
  char16_t *pcStack_90;
  qsizetype local_88;
  QArrayData *local_80;
  char16_t *local_78;
  qsizetype local_70;
  QArrayData *local_68;
  char16_t *local_60;
  qsizetype local_58;
  QMessageBox local_50 [40];
  QArrayData *local_28 [3];
  
  this->m_updateAvailable = available;
  QMessageBox::QMessageBox(local_50,(QWidget *)0x0);
  QMessageBox::setTextFormat((TextFormat)local_50);
  QMessageBox::setIcon((Icon)local_50);
  if (this->m_updateAvailable == false) {
    bVar7 = this->m_notifyOnFinish;
  }
  else if ((this->m_notifyOnUpdate != false) ||
          (bVar7 = this->m_notifyOnFinish, (bool)bVar7 == true)) {
    QMetaObject::tr((char *)&local_c8,(char *)&staticMetaObject,0x1193fe);
    if (this->m_mandatoryUpdate == true) {
      QMetaObject::tr((char *)&local_118,(char *)&staticMetaObject,0x119429);
      pQVar6 = pQStack_c0;
      pQVar1 = local_c8;
      qVar5 = local_118.d.size;
      pDVar4 = local_118.d.d;
      local_118.d.d = (Data *)local_c8;
      local_c8 = &pDVar4->super_QArrayData;
      pQStack_c0 = (QString *)local_118.d.ptr;
      local_118.d.ptr = (char16_t *)pQVar6;
      local_118.d.size = qStack_b8;
      qStack_b8 = qVar5;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
    }
    QVar10.m_data = (storage_type *)0xa;
    QVar10.m_size = (qsizetype)&local_118;
    QString::fromUtf8(QVar10);
    QString::append((QString *)&local_c8);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
      }
    }
    if ((this->m_changelog).d.size != 0) {
      QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1194a8);
      QString::arg((QString *)&local_118,(int)&local_e0,(QChar)((short)this + L'x'));
      QString::append((QString *)&local_c8);
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_e0 != (QArrayData *)0x0) {
        LOCK();
        (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_e0,2,8);
        }
      }
    }
    QMetaObject::tr((char *)local_28,(char *)&staticMetaObject,0x1194d1);
    local_68 = &((this->m_latestVersion).d.d)->super_QArrayData;
    local_60 = (this->m_latestVersion).d.ptr;
    local_58 = (this->m_latestVersion).d.size;
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::arg((QString *)&local_98,(int)local_28,(QChar)(char16_t)&local_68);
    local_80 = &((this->m_moduleName).d.d)->super_QArrayData;
    local_78 = (this->m_moduleName).d.ptr;
    local_70 = (this->m_moduleName).d.size;
    if (local_80 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_80->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_80->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::arg((QString *)&local_b0,(int)&local_98,(QChar)(char16_t)&local_80);
    QVar11.m_data = (storage_type *)0x4;
    QVar11.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar11);
    QString::append((QString *)&local_f8);
    local_e0 = &(local_f8.d)->super_QArrayData;
    local_d8 = local_f8.ptr;
    qStack_d0 = local_f8.size;
    if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar12.m_data = (storage_type *)0x5;
    QVar12.m_size = (qsizetype)&local_118;
    QString::fromUtf8(QVar12);
    QString::append((QString *)&local_e0);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d)->super_QArrayData,2,8);
      }
    }
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,2,8);
      }
    }
    if (local_80 != (QArrayData *)0x0) {
      LOCK();
      (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_80,2,8);
      }
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,8);
      }
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,8);
      }
    }
    if (local_28[0] != (QArrayData *)0x0) {
      LOCK();
      (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_28[0],2,8);
      }
    }
    QMessageBox::setText((QString *)local_50);
    QMessageBox::setInformativeText((QString *)local_50);
    QMessageBox::setStandardButtons(local_50,0x14000);
    QMessageBox::setDefaultButton((StandardButton)local_50);
    iVar8 = QDialog::exec();
    if (iVar8 == 0x4000) {
      pQVar1 = &((this->m_openUrl).d.d)->super_QArrayData;
      lVar2 = (this->m_openUrl).d.size;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
      if (lVar2 == 0) {
        if (this->m_downloaderEnabled == true) {
          pDVar3 = this->m_downloader;
          local_118.d.d = (this->m_url).d.d;
          local_118.d.ptr = (this->m_url).d.ptr;
          local_118.d.size = (this->m_url).d.size;
          if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          Downloader::setUrlId(pDVar3,&local_118);
          if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
            }
          }
          pDVar3 = this->m_downloader;
          local_b0 = &((this->m_downloadUrl).d.d)->super_QArrayData;
          local_a8 = (this->m_downloadUrl).d.ptr;
          local_a0 = (this->m_downloadUrl).d.size;
          if (local_b0 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&local_b0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&local_b0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QVar15.m_data = (storage_type *)0x1;
          QVar15.m_size = (qsizetype)&local_118;
          QString::fromUtf8(QVar15);
          local_98 = &(local_118.d.d)->super_QArrayData;
          pcStack_90 = local_118.d.ptr;
          local_88 = local_118.d.size;
          QString::split(&local_f8,&local_b0,&local_98,0,1);
          iVar9 = QList<QString>::end((QList<QString> *)&local_f8);
          Downloader::setFileName(pDVar3,iVar9.i + -1);
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_98,2,8);
            }
          }
          if (local_b0 != (QArrayData *)0x0) {
            LOCK();
            (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_b0,2,8);
            }
          }
          Downloader::setMandatoryUpdate(this->m_downloader,this->m_mandatoryUpdate);
          local_118.d.d = (this->m_downloadUrl).d.d;
          local_118.d.ptr = (this->m_downloadUrl).d.ptr;
          local_118.d.size = (this->m_downloadUrl).d.size;
          if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QUrl::QUrl((QUrl *)&local_f8,(QString *)&local_118,TolerantMode);
          if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
            }
          }
          QUrl::setUserName((QString *)&local_f8,(int)this + 0xf0);
          QUrl::setPassword((QString *)&local_f8,(int)this + 0x108);
          Downloader::startDownload(this->m_downloader,(QUrl *)&local_f8);
          QUrl::~QUrl((QUrl *)&local_f8);
          goto LAB_00111848;
        }
        local_118.d.d = (this->m_downloadUrl).d.d;
        local_118.d.ptr = (this->m_downloadUrl).d.ptr;
        local_118.d.size = (this->m_downloadUrl).d.size;
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QUrl::QUrl((QUrl *)&local_f8,(QString *)&local_118,TolerantMode);
        QDesktopServices::openUrl((QUrl *)&local_f8);
      }
      else {
        local_118.d.d = (this->m_openUrl).d.d;
        local_118.d.ptr = (this->m_openUrl).d.ptr;
        local_118.d.size = (this->m_openUrl).d.size;
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QUrl::QUrl((QUrl *)&local_f8,(QString *)&local_118,TolerantMode);
        QDesktopServices::openUrl((QUrl *)&local_f8);
      }
      QUrl::~QUrl((QUrl *)&local_f8);
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
        }
      }
    }
    else if (this->m_mandatoryUpdate == true) {
      QCoreApplication::quit();
    }
LAB_00111848:
    if (local_e0 != (QArrayData *)0x0) {
      LOCK();
      (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_e0,2,8);
      }
    }
    if (local_c8 != (QArrayData *)0x0) {
      LOCK();
      (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_c8,2,8);
      }
    }
    goto LAB_0011188e;
  }
  if ((bVar7 & 1) != 0) {
    QMessageBox::setStandardButtons(local_50,0x200000);
    QMetaObject::tr((char *)&local_118,(char *)&staticMetaObject,0x1194fb);
    QMessageBox::setInformativeText((QString *)local_50);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
      }
    }
    QMetaObject::tr((char *)&local_b0,(char *)&staticMetaObject,0x119523);
    local_98 = &((this->m_moduleName).d.d)->super_QArrayData;
    pcStack_90 = (this->m_moduleName).d.ptr;
    local_88 = (this->m_moduleName).d.size;
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::arg((QString *)&local_f8,(int)&local_b0,(QChar)(char16_t)&local_98);
    QVar13.m_data = (storage_type *)0x4;
    QVar13.m_size = (qsizetype)&local_e0;
    QString::fromUtf8(QVar13);
    QString::append((QString *)&local_e0);
    local_c8 = local_e0;
    pQStack_c0 = local_d8;
    qStack_b8 = qStack_d0;
    if (local_e0 != (QArrayData *)0x0) {
      LOCK();
      (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar14.m_data = (storage_type *)0x5;
    QVar14.m_size = (qsizetype)&local_118;
    QString::fromUtf8(QVar14);
    QString::append((QString *)&local_c8);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
      }
    }
    QMessageBox::setText((QString *)local_50);
    if (local_c8 != (QArrayData *)0x0) {
      LOCK();
      (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_c8,2,8);
      }
    }
    if (local_e0 != (QArrayData *)0x0) {
      LOCK();
      (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_e0,2,8);
      }
    }
    if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d)->super_QArrayData,2,8);
      }
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,8);
      }
    }
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,2,8);
      }
    }
    QDialog::exec();
  }
LAB_0011188e:
  QMessageBox::~QMessageBox(local_50);
  return;
}

Assistant:

void Updater::setUpdateAvailable(const bool available)
{
   m_updateAvailable = available;

   QMessageBox box;
   box.setTextFormat(Qt::RichText);
   box.setIcon(QMessageBox::Information);

   if (updateAvailable() && (notifyOnUpdate() || notifyOnFinish()))
   {
      QString text = tr("Would you like to download the update now?");
      if (m_mandatoryUpdate)
      {
         text = tr("Would you like to download the update now?<br />This is a mandatory update, exiting now will close "
                   "the application.");
      }
      text += "<br/><br/>";
      if (!m_changelog.isEmpty())
         text += tr("<strong>Change log:</strong><br/>%1").arg(m_changelog);

      QString title
          = "<h3>" + tr("Version %1 of %2 has been released!").arg(latestVersion()).arg(moduleName()) + "</h3>";

      box.setText(title);
      box.setInformativeText(text);
      box.setStandardButtons(QMessageBox::No | QMessageBox::Yes);
      box.setDefaultButton(QMessageBox::Yes);

      if (box.exec() == QMessageBox::Yes)
      {
         if (!openUrl().isEmpty())
            QDesktopServices::openUrl(QUrl(openUrl()));

         else if (downloaderEnabled())
         {
            m_downloader->setUrlId(url());
            m_downloader->setFileName(downloadUrl().split("/").last());
            m_downloader->setMandatoryUpdate(m_mandatoryUpdate);
            auto url = QUrl(downloadUrl());
            url.setUserName(m_downloadUserName);
            url.setPassword(m_downloadPassword);
            m_downloader->startDownload(url);
         }

         else
            QDesktopServices::openUrl(QUrl(downloadUrl()));
      }
      else
      {
         if (m_mandatoryUpdate)
         {
            QApplication::quit();
         }
      }
   }

   else if (notifyOnFinish())
   {
      box.setStandardButtons(QMessageBox::Close);
      box.setInformativeText(tr("No updates are available for the moment"));
      box.setText("<h3>"
                  + tr("Congratulations! You are running the "
                       "latest version of %1")
                        .arg(moduleName())
                  + "</h3>");

      box.exec();
   }
}